

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::StringLiteral::StringLiteral
          (StringLiteral *this,Type *type,string_view value,string_view rawValue,
          ConstantValue *intVal,SourceRange sourceRange)

{
  (this->super_Expression).kind = StringLiteral;
  (this->super_Expression).type.ptr = type;
  (this->super_Expression).constant = (ConstantValue *)0x0;
  (this->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (this->super_Expression).sourceRange.startLoc = sourceRange.startLoc;
  (this->super_Expression).sourceRange.endLoc = sourceRange.endLoc;
  (this->value)._M_len = value._M_len;
  (this->value)._M_str = value._M_str;
  (this->rawValue)._M_len = rawValue._M_len;
  (this->rawValue)._M_str = rawValue._M_str;
  this->intStorage = intVal;
  return;
}

Assistant:

StringLiteral::StringLiteral(const Type& type, std::string_view value, std::string_view rawValue,
                             ConstantValue& intVal, SourceRange sourceRange) :
    Expression(ExpressionKind::StringLiteral, type, sourceRange), value(value), rawValue(rawValue),
    intStorage(&intVal) {
}